

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O3

XrResult ApiLayerInterface::GetInstanceExtensionProperties
                   (string *openxr_command,char *layer_name,
                   vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   *extension_properties)

{
  ApiLayerManifestFile *pAVar1;
  size_t __n;
  pointer pbVar2;
  undefined8 __args;
  undefined8 uVar3;
  XrResult XVar4;
  int iVar5;
  long lVar6;
  pointer pbVar7;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *exp_layer_man_file;
  long lVar8;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  manifest_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  env_enabled_layers;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  local_88;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  local_88.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((layer_name == (char *)0x0) || (*layer_name == '\0')) {
    XVar4 = ApiLayerManifestFile::FindManifestFiles
                      (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&local_88);
    if (XR_ERROR_VALIDATION_FAILURE < XVar4) {
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = (pointer)0x0;
      local_68._16_8_ = (pointer)0x0;
      AddEnvironmentApiLayers
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68);
      if (local_68._0_8_ != local_68._8_8_) {
        local_48._M_allocated_capacity = 0;
        local_48._8_8_ =
             (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)0x0;
        local_38 = 0;
        XVar4 = ApiLayerManifestFile::FindManifestFiles
                          (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,
                           (vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                            *)&local_48);
        uVar3 = local_48._8_8_;
        pbVar7 = (pointer)local_68._0_8_;
        pbVar2 = (pointer)local_68._8_8_;
        __args = local_48._M_allocated_capacity;
        if (XR_ERROR_VALIDATION_FAILURE < XVar4) {
          for (; local_68._0_8_ = pbVar7, local_68._8_8_ = pbVar2, __args != uVar3;
              __args = (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                        *)(__args + 8)) {
            for (; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
              pAVar1 = (((unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                          *)__args)->_M_t).
                       super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                       .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl;
              __n = pbVar7->_M_string_length;
              if ((__n == (pAVar1->_layer_name)._M_string_length) &&
                 ((__n == 0 ||
                  (iVar5 = memcmp((pbVar7->_M_dataplus)._M_p,(pAVar1->_layer_name)._M_dataplus._M_p,
                                  __n), iVar5 == 0)))) {
                std::
                vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
                ::
                emplace_back<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>
                          ((vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
                            *)&local_88,
                           (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                            *)__args);
                break;
              }
            }
            pbVar7 = (pointer)local_68._0_8_;
            pbVar2 = (pointer)local_68._8_8_;
          }
        }
        std::
        vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
        ::~vector((vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   *)&local_48);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68);
    }
    if ((long)local_88.
              super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_88.
              super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar6 = (long)local_88.
                    super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.
                    super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar8 = 0;
      do {
        ManifestFile::GetInstanceExtensionProperties
                  (&(local_88.
                     super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                     super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                     .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                    super_ManifestFile,extension_properties);
        lVar8 = lVar8 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
    }
  }
  else {
    XVar4 = ApiLayerManifestFile::FindManifestFiles
                      (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&local_88);
    if (XR_ERROR_VALIDATION_FAILURE < XVar4) {
      XVar4 = ApiLayerManifestFile::FindManifestFiles
                        (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,&local_88);
      if (XVar4 < XR_SUCCESS) {
        local_68._0_8_ = (pointer)(local_68 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,
                   "ApiLayerInterface::GetInstanceExtensionProperties - failed searching for API layer manifest files"
                   ,"");
        local_48._M_allocated_capacity = 0;
        local_48._8_8_ =
             (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)0x0;
        local_38 = 0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,(string *)local_68,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_48);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                  ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_48);
        if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
        }
      }
      else {
        XVar4 = XR_ERROR_API_LAYER_NOT_PRESENT;
        if ((long)local_88.
                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_88.
                  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          lVar8 = (long)local_88.
                        super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.
                        super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar6 = 0;
          do {
            iVar5 = std::__cxx11::string::compare
                              ((char *)&(local_88.
                                         super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
                                         super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                         .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>.
                                        _M_head_impl)->_layer_name);
            if (iVar5 == 0) {
              ManifestFile::GetInstanceExtensionProperties
                        (&(local_88.
                           super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
                           super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                           .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                          super_ManifestFile,extension_properties);
              goto LAB_001065e8;
            }
            lVar6 = lVar6 + 1;
          } while (lVar8 + (ulong)(lVar8 == 0) != lVar6);
        }
      }
      goto LAB_001065ea;
    }
  }
LAB_001065e8:
  XVar4 = XR_SUCCESS;
LAB_001065ea:
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&local_88);
  return XVar4;
}

Assistant:

XrResult ApiLayerInterface::GetInstanceExtensionProperties(const std::string& openxr_command, const char* layer_name,
                                                           std::vector<XrExtensionProperties>& extension_properties) {
    std::vector<std::unique_ptr<ApiLayerManifestFile>> manifest_files;

    // If a layer name is supplied, only use the information out of that one layer
    if (nullptr != layer_name && 0 != strlen(layer_name)) {
        XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
        if (XR_SUCCEEDED(result)) {
            // Find any explicit layers which we may need to report information for.
            result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, manifest_files);
            if (XR_FAILED(result)) {
                LoaderLogger::LogErrorMessage(
                    openxr_command,
                    "ApiLayerInterface::GetInstanceExtensionProperties - failed searching for API layer manifest files");
                return result;
            }

            bool found = false;
            size_t num_files = manifest_files.size();
            for (size_t man_file = 0; man_file < num_files; ++man_file) {
                // If a layer with the provided name exists, get it's instance extension information.
                if (manifest_files[man_file]->LayerName() == layer_name) {
                    manifest_files[man_file]->GetInstanceExtensionProperties(extension_properties);
                    found = true;
                    break;
                }
            }

            // If nothing found, report 0
            if (!found) {
                return XR_ERROR_API_LAYER_NOT_PRESENT;
            }
        }
        // Otherwise, we want to add only implicit API layers and explicit API layers enabled using the environment variables
    } else {
        XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER, manifest_files);
        if (XR_SUCCEEDED(result)) {
            // Find any environmentally enabled explicit layers.  If they're present, treat them like implicit layers
            // since we know that they're going to be enabled.
            std::vector<std::string> env_enabled_layers;
            AddEnvironmentApiLayers(env_enabled_layers);
            if (!env_enabled_layers.empty()) {
                std::vector<std::unique_ptr<ApiLayerManifestFile>> exp_layer_man_files = {};
                result =
                    ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER, exp_layer_man_files);
                if (XR_SUCCEEDED(result)) {
                    for (auto& exp_layer_man_file : exp_layer_man_files) {
                        for (std::string& enabled_layer : env_enabled_layers) {
                            // If this is an enabled layer, transfer it over to the manifest list.
                            if (enabled_layer == exp_layer_man_file->LayerName()) {
                                manifest_files.push_back(std::move(exp_layer_man_file));
                                break;
                            }
                        }
                    }
                }
            }
        }

        // Grab the layer instance extensions information
        size_t num_files = manifest_files.size();
        for (size_t man_file = 0; man_file < num_files; ++man_file) {
            manifest_files[man_file]->GetInstanceExtensionProperties(extension_properties);
        }
    }
    return XR_SUCCESS;
}